

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_buffer_pool.cpp
# Opt level: O3

int __thiscall
libtorrent::disk_buffer_pool::allocate_iovec
          (disk_buffer_pool *this,span<libtorrent::span<char>_> iov)

{
  void *__ptr;
  mutex_type *pmVar1;
  long lVar2;
  char *extraout_RDX;
  char *pcVar3;
  char *extraout_RDX_00;
  int iVar4;
  unique_lock<std::mutex> *puVar5;
  unique_lock<std::mutex> *l_00;
  long lVar6;
  unique_lock<std::mutex> *puVar7;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_40;
  
  lVar2 = iov.m_len;
  puVar5 = (unique_lock<std::mutex> *)iov.m_ptr;
  local_40._M_device = &this->m_pool_mutex;
  local_40._M_owns = false;
  l_00 = puVar5;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar4 = 0;
  if (lVar2 != 0) {
    pcVar3 = extraout_RDX;
    puVar7 = puVar5;
    do {
      pmVar1 = (mutex_type *)allocate_buffer_impl(this,l_00,pcVar3);
      puVar7->_M_device = pmVar1;
      *(undefined8 *)&puVar7->_M_owns = 0x4000;
      if (pmVar1 == (mutex_type *)0x0) {
        lVar6 = 0;
        goto LAB_003268fc;
      }
      puVar7 = puVar7 + 1;
      pcVar3 = extraout_RDX_00;
      iVar4 = 0;
    } while (puVar7 != puVar5 + lVar2);
  }
  goto LAB_00326916;
  while( true ) {
    free(__ptr);
    this->m_in_use = this->m_in_use + -1;
    lVar6 = lVar6 + 0x10;
    if (lVar2 * 0x10 == lVar6) break;
LAB_003268fc:
    __ptr = *(void **)((long)&puVar5->_M_device + lVar6);
    iVar4 = -1;
    if (__ptr == (void *)0x0) break;
  }
LAB_00326916:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return iVar4;
}

Assistant:

int disk_buffer_pool::allocate_iovec(span<iovec_t> iov)
	{
		std::unique_lock<std::mutex> l(m_pool_mutex);
		for (auto& i : iov)
		{
			i = { allocate_buffer_impl(l, "pending read"), std::size_t(default_block_size)};
			if (i.data() == nullptr)
			{
				// uh oh. We failed to allocate the buffer!
				// we need to roll back and free all the buffers
				// we've already allocated
				for (auto j : iov)
				{
					if (j.data() == nullptr) break;
					char* buf = j.data();
					TORRENT_ASSERT(is_disk_buffer(buf, l));
					remove_buffer_in_use(buf);
					free_buffer_impl(buf, l);
				}
				return -1;
			}
		}
		return 0;
	}